

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalsList.h
# Opt level: O1

IntervalsList * __thiscall
dg::dda::IntervalsList::intersectWith(IntervalsList *this,IntervalsList *rhs)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base **pp_Var5;
  _List_node_base *p_Var6;
  _Self __tmp;
  _List_node_base *p_Var7;
  IntervalsList *unaff_R15;
  IntervalsList *pIVar8;
  
  p_Var6 = (this->intervals).
           super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = (_List_node_base *)rhs;
  pIVar8 = this;
  if (p_Var6 != (_List_node_base *)this) {
    do {
      p_Var4 = (((IntervalsList *)p_Var4)->intervals).
               super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)rhs) {
        return this;
      }
      p_Var7 = p_Var6;
      do {
        p_Var2 = *(_List_node_base **)((long)(p_Var7 + 1) + 8);
        p_Var3 = p_Var4[1]._M_next;
        if (p_Var3 <= p_Var2) {
          p_Var6 = p_Var7;
          pIVar8 = unaff_R15;
          if (p_Var7[1]._M_next <= *(_List_node_base **)((long)(p_Var4 + 1) + 8)) {
            pp_Var5 = &p_Var7[1]._M_next;
            if (p_Var7[1]._M_next < p_Var3) {
              pp_Var5 = &p_Var4[1]._M_next;
            }
            p_Var7[1]._M_next = *pp_Var5;
            pp_Var5 = (_List_node_base **)((long)(p_Var7 + 1) + 8);
            if (*(_List_node_base **)((long)(p_Var4 + 1) + 8U) < p_Var2) {
              pp_Var5 = (_List_node_base **)((long)(p_Var4 + 1) + 8U);
            }
            *(_List_node_base **)((long)(p_Var7 + 1) + 8) = *pp_Var5;
          }
          break;
        }
        p_Var6 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                    *)&p_Var7->_M_next)->
                 super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        psVar1 = &(this->intervals).
                  super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var7,0x20);
        p_Var7 = p_Var6;
        pIVar8 = this;
      } while (p_Var6 != (_List_node_base *)this);
      unaff_R15 = pIVar8;
    } while (p_Var3 <= p_Var2);
  }
  return pIVar8;
}

Assistant:

IntervalsList &intersectWith(const IntervalsList &rhs) {
        if (intervals.empty())
            return *this;

        auto it = intervals.begin();
        for (const auto &RI : rhs.intervals) {
            while (it->end < RI.start) {
                auto tmp = it++;
                intervals.erase(tmp);
                if (it == intervals.end()) {
                    return *this;
                }
            }
            if (it->overlaps(RI)) {
                it->start = std::max(it->start, RI.start);
                it->end = std::min(it->end, RI.end);
            }
        }

        return *this;
    }